

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int SUNQRfact(int n,sunrealtype **h,sunrealtype *q,int job)

{
  double dVar1;
  long lVar2;
  sunrealtype *psVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (job == 0) {
    uVar7 = 0;
    uVar9 = (ulong)(uint)n;
    if (n < 1) {
      uVar9 = uVar7;
    }
    uVar4 = 0;
    while (n = (int)uVar4, uVar7 != uVar9) {
      pdVar10 = q + 1;
      for (lVar6 = 0; lVar6 < (long)(uVar7 - 1); lVar6 = lVar6 + 1) {
        psVar3 = h[lVar6 + 1];
        dVar12 = h[lVar6][uVar7];
        dVar1 = psVar3[uVar7];
        dVar14 = pdVar10[-1];
        dVar13 = *pdVar10;
        h[lVar6][uVar7] = dVar14 * dVar12 - dVar1 * dVar13;
        psVar3[uVar7] = dVar13 * dVar12 + dVar1 * dVar14;
        pdVar10 = pdVar10 + 2;
      }
      psVar3 = h[uVar7];
      dVar12 = psVar3[uVar7];
      dVar1 = h[uVar7 + 1][uVar7];
      dVar14 = 0.0;
      dVar13 = 1.0;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (ABS(dVar12) <= ABS(dVar1)) {
          dVar13 = dVar12 / dVar1;
          dVar14 = dVar13 * dVar13 + 1.0;
          uVar11 = -(ulong)(0.0 < dVar14);
          dVar14 = (double)(~uVar11 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar14)) & uVar11);
          dVar13 = -dVar14 * dVar13;
        }
        else {
          dVar14 = dVar1 / dVar12;
          dVar13 = dVar14 * dVar14 + 1.0;
          uVar11 = -(ulong)(0.0 < dVar13);
          dVar13 = (double)(~uVar11 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar13)) & uVar11);
          dVar14 = -dVar13 * dVar14;
        }
      }
      q[uVar7 * 2] = dVar13;
      q[uVar7 * 2 + 1] = dVar14;
      dVar12 = dVar12 * dVar13 - dVar1 * dVar14;
      psVar3[uVar7] = dVar12;
      uVar7 = uVar7 + 1;
      uVar11 = uVar7 & 0xffffffff;
      if (dVar12 != 0.0) {
        uVar11 = uVar4;
      }
      if (!NAN(dVar12)) {
        uVar4 = uVar11;
      }
    }
  }
  else {
    uVar5 = n - 1;
    lVar6 = (long)(int)uVar5;
    lVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    for (; uVar9 * 8 != lVar8; lVar8 = lVar8 + 8) {
      lVar2 = *(long *)((long)h + lVar8 + 8);
      dVar12 = *(double *)(*(long *)((long)h + lVar8) + lVar6 * 8);
      dVar1 = *(double *)(lVar2 + lVar6 * 8);
      dVar14 = *(double *)((long)q + lVar8 * 2);
      dVar13 = *(double *)((long)q + lVar8 * 2 + 8);
      *(double *)(*(long *)((long)h + lVar8) + lVar6 * 8) = dVar14 * dVar12 - dVar1 * dVar13;
      *(double *)(lVar2 + lVar6 * 8) = dVar13 * dVar12 + dVar1 * dVar14;
    }
    psVar3 = h[lVar6];
    dVar12 = psVar3[lVar6];
    dVar1 = h[n][lVar6];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (ABS(dVar12) <= ABS(dVar1)) {
        dVar13 = dVar12 / dVar1;
        dVar14 = dVar13 * dVar13 + 1.0;
        uVar9 = -(ulong)(0.0 < dVar14);
        dVar14 = (double)(~uVar9 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar14)) & uVar9);
        dVar13 = -dVar14 * dVar13;
      }
      else {
        dVar14 = dVar1 / dVar12;
        dVar13 = dVar14 * dVar14 + 1.0;
        uVar9 = -(ulong)(0.0 < dVar13);
        dVar13 = (double)(~uVar9 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar13)) & uVar9);
        dVar14 = -dVar13 * dVar14;
      }
    }
    else {
      dVar13 = 1.0;
      dVar14 = 0.0;
    }
    q[(int)(uVar5 * 2)] = dVar13;
    q[(int)(uVar5 * 2 + 1)] = dVar14;
    dVar12 = dVar12 * dVar13 - dVar1 * dVar14;
    psVar3[lVar6] = dVar12;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      n = 0;
    }
  }
  return n;
}

Assistant:

int SUNQRfact(int n, sunrealtype** h, sunrealtype* q, int job)
{
  sunrealtype c, s, temp1, temp2, temp3;
  int i, j, k, q_ptr, n_minus_1, code = 0;

  switch (job)
  {
  case 0:

    /* Compute a new factorization of H */

    code = 0;
    for (k = 0; k < n; k++)
    {
      /* Multiply column k by the previous k-1 Givens rotations */

      for (j = 0; j < k - 1; j++)
      {
        i           = 2 * j;
        temp1       = h[j][k];
        temp2       = h[j + 1][k];
        c           = q[i];
        s           = q[i + 1];
        h[j][k]     = c * temp1 - s * temp2;
        h[j + 1][k] = s * temp1 + c * temp2;
      }

      /* Compute the Givens rotation components c and s */

      q_ptr = 2 * k;
      temp1 = h[k][k];
      temp2 = h[k + 1][k];
      if (temp2 == ZERO)
      {
        c = ONE;
        s = ZERO;
      }
      else if (SUNRabs(temp2) >= SUNRabs(temp1))
      {
        temp3 = temp1 / temp2;
        s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        c     = -s * temp3;
      }
      else
      {
        temp3 = temp2 / temp1;
        c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        s     = -c * temp3;
      }
      q[q_ptr]     = c;
      q[q_ptr + 1] = s;
      if ((h[k][k] = c * temp1 - s * temp2) == ZERO) { code = k + 1; }
    }
    break;

  default:

    /* Update the factored H to which a new column has been added */

    n_minus_1 = n - 1;
    code      = 0;

    /* Multiply the new column by the previous n-1 Givens rotations */

    for (k = 0; k < n_minus_1; k++)
    {
      i                   = 2 * k;
      temp1               = h[k][n_minus_1];
      temp2               = h[k + 1][n_minus_1];
      c                   = q[i];
      s                   = q[i + 1];
      h[k][n_minus_1]     = c * temp1 - s * temp2;
      h[k + 1][n_minus_1] = s * temp1 + c * temp2;
    }

    /* Compute new Givens rotation and multiply it times the last two
       entries in the new column of H.  Note that the second entry of
       this product will be 0, so it is not necessary to compute it. */

    temp1 = h[n_minus_1][n_minus_1];
    temp2 = h[n][n_minus_1];
    if (temp2 == ZERO)
    {
      c = ONE;
      s = ZERO;
    }
    else if (SUNRabs(temp2) >= SUNRabs(temp1))
    {
      temp3 = temp1 / temp2;
      s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      c     = -s * temp3;
    }
    else
    {
      temp3 = temp2 / temp1;
      c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      s     = -c * temp3;
    }
    q_ptr        = 2 * n_minus_1;
    q[q_ptr]     = c;
    q[q_ptr + 1] = s;
    if ((h[n_minus_1][n_minus_1] = c * temp1 - s * temp2) == ZERO) { code = n; }
  }

  return (code);
}